

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

uint nk_check_flags_text(nk_context *ctx,char *text,int len,uint flags,uint value)

{
  uint uVar1;
  int iVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4f6a,
                  "unsigned int nk_check_flags_text(struct nk_context *, const char *, int, unsigned int, unsigned int)"
                 );
  }
  if (text != (char *)0x0) {
    iVar2 = nk_check_text(ctx,text,len,value & flags);
    uVar1 = ~value & flags;
    if (iVar2 != 0) {
      uVar1 = value | flags;
    }
    return uVar1;
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x4f6b,
                "unsigned int nk_check_flags_text(struct nk_context *, const char *, int, unsigned int, unsigned int)"
               );
}

Assistant:

NK_API unsigned int
nk_check_flags_text(struct nk_context *ctx, const char *text, int len,
    unsigned int flags, unsigned int value)
{
    int old_active;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    if (!ctx || !text) return flags;
    old_active = (int)((flags & value) & value);
    if (nk_check_text(ctx, text, len, old_active))
        flags |= value;
    else flags &= ~value;
    return flags;
}